

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_create_array(JSContext *ctx,int len,JSValue *tab)

{
  JSShape *sh;
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue val;
  int iVar3;
  JSRefCountHeader *p;
  JSValueUnion JVar4;
  ulong uVar5;
  int64_t iVar6;
  int64_t *piVar7;
  ulong uVar8;
  JSRefCountHeader *p_1;
  JSValue JVar9;
  JSValue prop;
  
  sh = ctx->array_shape;
  (sh->header).ref_count = (sh->header).ref_count + 1;
  JVar9 = JS_NewObjectFromShape(ctx,sh,2);
  iVar6 = JVar9.tag;
  JVar4 = JVar9.u;
  if ((uint)JVar9.tag == 6) {
LAB_0013a606:
    uVar8 = 0;
    uVar5 = 0;
    iVar6 = 6;
  }
  else {
    if (0 < len) {
      piVar7 = &tab->tag;
      uVar8 = 0;
      do {
        JVar1 = (JSValueUnion)((JSValueUnion *)(piVar7 + -1))->ptr;
        iVar2 = *piVar7;
        if (0xfffffff4 < (uint)iVar2) {
          *(int *)JVar1.ptr = *JVar1.ptr + 1;
        }
        val.tag = iVar2;
        val.u.ptr = JVar1.ptr;
        prop.tag = 0;
        prop.u.ptr = (void *)uVar8;
        iVar3 = JS_DefinePropertyValueValue(ctx,JVar9,prop,val,7);
        if (iVar3 < 0) {
          if ((0xfffffff4 < (uint)JVar9.tag) &&
             (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar9);
          }
          goto LAB_0013a606;
        }
        uVar8 = uVar8 + 1;
        piVar7 = piVar7 + 2;
      } while ((uint)len != uVar8);
    }
    uVar5 = (ulong)JVar4.ptr & 0xffffffff00000000;
    uVar8 = (ulong)JVar4.ptr & 0xffffffff;
  }
  JVar9.u.ptr = (void *)(uVar8 | uVar5);
  JVar9.tag = iVar6;
  return JVar9;
}

Assistant:

static JSValue js_create_array(JSContext *ctx, int len, JSValueConst *tab)
{
    JSValue obj;
    int i;

    obj = JS_NewArray(ctx);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    for(i = 0; i < len; i++) {
        if (JS_CreateDataPropertyUint32(ctx, obj, i, JS_DupValue(ctx, tab[i]), 0) < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}